

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O2

void InsertionSort<int>(int *a,int n,int h,_func_bool_int_int *compare)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  do {
    if ((long)n <= (long)uVar5) {
      return;
    }
    iVar1 = a[uVar5];
    uVar4 = uVar5;
    while (iVar3 = (int)uVar4, 0 < iVar3) {
      bVar2 = (*compare)(a[iVar3 - h],iVar1);
      if (!bVar2) break;
      a[uVar4 & 0xffffffff] = a[iVar3 - h];
      uVar4 = (ulong)(uint)(iVar3 - h);
    }
    a[iVar3] = iVar1;
    uVar5 = uVar5 + (long)h;
  } while( true );
}

Assistant:

inline void InsertionSort(T * a, int n, int h, bool(*compare)(T, T))
{
	int temp, j;
	for (int i = 0; i < n; i += h) {
		j = i;
		temp = a[i];
		while ((j > 0) && compare(a[j - h], temp)) {
			a[j] = a[j - h];
			j -= h;
		}
		a[j] = temp;
	}
}